

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O2

bool __thiscall SightCheck::P_SightTraverseIntercepts(SightCheck *this)

{
  long *plVar1;
  extsector_t *peVar2;
  F3DFloor **ppFVar3;
  undefined8 *puVar4;
  double dVar5;
  double dVar6;
  intercept_t *piVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  intercept_t *piVar11;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  divline_t local_58;
  
  lVar10 = 0;
  uVar8 = intercepts.Count;
  for (uVar9 = 0; piVar11 = intercepts.Array, uVar9 < intercepts.Count; uVar9 = uVar9 + 1) {
    plVar1 = *(long **)((long)&(intercepts.Array)->d + lVar10);
    local_58.x = *(double *)*plVar1;
    local_58.y = ((double *)*plVar1)[1];
    local_58.dx = (double)plVar1[2];
    local_58.dy = (double)plVar1[3];
    dVar15 = P_InterceptVector(&this->Trace,&local_58);
    *(double *)((long)&piVar11->frac + lVar10) = dVar15;
    if (dVar15 < this->Startfrac) {
      *(undefined8 *)((long)&piVar11->frac + lVar10) = 0x41dfffffffc00000;
      uVar8 = uVar8 - 1;
    }
    lVar10 = lVar10 + 0x18;
  }
  piVar11 = (intercept_t *)0x0;
  while (bVar12 = uVar8 != 0, uVar8 = uVar8 - 1, bVar12) {
    uVar9 = (ulong)intercepts.Count;
    uVar13 = 0xffc00000;
    uVar14 = 0x41dfffff;
    piVar7 = intercepts.Array;
    while (bVar12 = uVar9 != 0, uVar9 = uVar9 - 1, bVar12) {
      dVar15 = piVar7->frac;
      if (dVar15 <= (double)CONCAT44(uVar14,uVar13) && (double)CONCAT44(uVar14,uVar13) != dVar15) {
        piVar11 = piVar7;
      }
      if ((double)CONCAT44(uVar14,uVar13) <= dVar15) {
        dVar15 = (double)CONCAT44(uVar14,uVar13);
      }
      piVar7 = piVar7 + 1;
      uVar13 = SUB84(dVar15,0);
      uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
    }
    if (piVar11 != (intercept_t *)0x0) {
      bVar12 = PTR_SightTraverse(this,piVar11);
      if (!bVar12) {
        return false;
      }
      piVar11->frac = 2147483647.0;
    }
  }
  bVar12 = true;
  if (this->lastsector == (sector_t_conflict *)this->seeingthing->Sector) {
    peVar2 = this->lastsector->e;
    uVar9 = (ulong)(peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if (uVar9 != 0) {
      dVar15 = (this->sightstart).Z;
      dVar16 = this->topslope + dVar15;
      dVar15 = dVar15 + this->bottomslope;
      ppFVar3 = (peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
      for (lVar10 = 0; bVar12 = uVar9 << 3 == lVar10, !bVar12; lVar10 = lVar10 + 8) {
        puVar4 = *(undefined8 **)((long)ppFVar3 + lVar10);
        uVar8 = *(uint *)(puVar4 + 0xb) & 2;
        if (((*(uint *)(puVar4 + 0xb) & 1) != 0 && uVar8 != this->myseethrough) &&
           ((uVar8 != 0 || ((this->Flags & 8U) == 0)))) {
          dVar5 = secplane_t::ZatPoint((secplane_t *)*puVar4,this->seeingthing);
          dVar6 = secplane_t::ZatPoint((secplane_t *)puVar4[5],this->seeingthing);
          if ((this->Lastztop <= dVar5) &&
             (((dVar5 < dVar16 && (this->Lastzbottom <= dVar5)) && (dVar5 < dVar15)))) {
            return bVar12;
          }
          if (((dVar6 <= this->Lastztop) && (dVar6 <= this->Lastzbottom)) &&
             ((dVar15 < dVar6 && (dVar16 < dVar6)))) {
            return bVar12;
          }
        }
      }
    }
  }
  return bVar12;
}

Assistant:

bool SightCheck::P_SightTraverseIntercepts ()
{
	unsigned count;
	double dist;
	intercept_t *scan, *in;
	unsigned scanpos;
	divline_t dl;

	count = intercepts.Size ();
//
// calculate intercept distance
//
	for (scanpos = 0; scanpos < intercepts.Size (); scanpos++)
	{
		scan = &intercepts[scanpos];
		P_MakeDivline (scan->d.line, &dl);
		scan->frac = P_InterceptVector (&Trace, &dl);
		if (scan->frac < Startfrac)
		{
			scan->frac = INT_MAX;
			count--;
		}
	}

//
// go through in order
// proper order is needed to handle 3D floors and portals.
//
	in = NULL;

	while (count--)
	{
		dist = INT_MAX;
		for (scanpos = 0; scanpos < intercepts.Size (); scanpos++)
		{
			scan = &intercepts[scanpos];
			if (scan->frac < dist)
			{
				dist = scan->frac;
				in = scan;
			}
		}

		if (in != NULL)
		{
			if (!PTR_SightTraverse (in))
				return false;					// don't bother going farther
			in->frac = INT_MAX;
		}
	}

	if (lastsector == seeingthing->Sector && lastsector->e->XFloor.ffloors.Size())
	{
		// we must do one last check whether the trace has crossed a 3D floor in the last sector

		double topz = topslope + sightstart.Z;
		double bottomz = bottomslope + sightstart.Z;

		for (auto rover : lastsector->e->XFloor.ffloors)
		{
			if ((rover->flags & FF_SOLID) == myseethrough || !(rover->flags & FF_EXISTS)) continue;
			if ((Flags & SF_IGNOREWATERBOUNDARY) && (rover->flags & FF_SOLID) == 0) continue;

			double ff_bottom = rover->bottom.plane->ZatPoint(seeingthing);
			double ff_top = rover->top.plane->ZatPoint(seeingthing);

			if (Lastztop <= ff_bottom && topz > ff_bottom && Lastzbottom <= ff_bottom && bottomz > ff_bottom) return false;
			if (Lastzbottom >= ff_top && bottomz < ff_top && Lastztop >= ff_top && topz < ff_top) return false;
		}
	}
	return true;			// everything was traversed
}